

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O2

sexp_conflict
sexp_signal_set_contains_p_stub
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg0,sexp_conflict arg1)

{
  int iVar1;
  sexp_conflict psVar2;
  
  if (((ulong)arg0 & 3) != 0) {
    psVar2 = (sexp_conflict)sexp_type_exception(ctx,self,(long)(self->value).type.id >> 1);
    return psVar2;
  }
  if ((long)(self->value).type.id >> 1 == (ulong)arg0->tag) {
    if (((ulong)arg1 & 1) == 0) {
      if ((((ulong)arg1 & 2) != 0) || (arg1->tag != 0xc)) {
        psVar2 = (sexp_conflict)sexp_type_exception(ctx,self,2,arg1);
        return psVar2;
      }
      iVar1 = (int)(arg1->value).flonum_bits[0] * (int)(arg1->value).uvector.length;
    }
    else {
      iVar1 = (int)((long)arg1 >> 1);
    }
    iVar1 = sigismember((sigset_t *)(arg0->value).type.slots,iVar1);
    return (sexp_conflict)((ulong)(iVar1 != 0) << 8 | 0x3e);
  }
  psVar2 = (sexp_conflict)sexp_type_exception();
  return psVar2;
}

Assistant:

sexp sexp_signal_set_contains_p_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg0, sexp arg1) {
  sexp res;
  if (! (sexp_pointerp(arg0) && (sexp_pointer_tag(arg0) == sexp_unbox_fixnum(sexp_opcode_arg1_type(self)))))
    return sexp_type_exception(ctx, self, sexp_unbox_fixnum(sexp_opcode_arg1_type(self)), arg0);
  if (! sexp_exact_integerp(arg1))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, arg1);
  res = sexp_make_boolean(sigismember((sigset_t*)sexp_cpointer_value(arg0), sexp_sint_value(arg1)));
  return res;
}